

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_setReadHandler(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue *pJVar1;
  JSValue JVar2;
  JSValue v;
  long lVar3;
  int iVar4;
  JSRuntime *rt_00;
  JSThreadState *ts_00;
  JSOSRWHandler *pJVar5;
  JSContext *in_RDI;
  long in_R8;
  int in_R9D;
  JSValue JVar6;
  JSValue func;
  int fd;
  JSOSRWHandler *rh;
  JSThreadState *ts;
  JSRuntime *rt;
  JSOSRWHandler *in_stack_ffffffffffffff48;
  JSValueUnion *pJVar7;
  JSContext *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  JSContext *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  int local_5c;
  JSOSRWHandler *local_58;
  JSValueUnion local_10;
  int64_t local_8;
  
  rt_00 = JS_GetRuntime(in_RDI);
  ts_00 = (JSThreadState *)JS_GetRuntimeOpaque(rt_00);
  JVar6.tag._0_4_ = in_stack_ffffffffffffff80;
  JVar6.u = (JSValueUnion)in_stack_ffffffffffffff78;
  JVar6.tag._4_4_ = in_stack_ffffffffffffff84;
  iVar4 = JS_ToInt32((JSContext *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (int32_t *)in_stack_ffffffffffffff68,JVar6);
  lVar3 = local_10;
  if (iVar4 == 0) {
    pJVar1 = (JSValue *)(in_R8 + 0x10);
    JVar2 = *pJVar1;
    JVar6 = *pJVar1;
    iVar4 = JS_IsNull(*pJVar1);
    if (iVar4 == 0) {
      iVar4 = JS_IsFunction(in_RDI,JVar6);
      if (iVar4 == 0) {
        JVar6 = JS_ThrowTypeError(in_RDI,"not a function");
        return JVar6;
      }
      local_58 = find_rh(ts_00,local_5c);
      if (local_58 == (JSOSRWHandler *)0x0) {
        local_58 = (JSOSRWHandler *)
                   js_mallocz(in_stack_ffffffffffffff68,
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        if (local_58 == (JSOSRWHandler *)0x0) {
          local_10.ptr = (void *)(lVar3 << 0x20);
          local_8 = 6;
          return _local_10;
        }
        local_58->fd = local_5c;
        local_58->rw_func[0].u.ptr = (void *)((ulong)in_stack_ffffffffffffff74 << 0x20);
        local_58->rw_func[0].tag = 2;
        in_stack_ffffffffffffff60 = 0;
        local_58->rw_func[1].u.ptr = (void *)((ulong)in_stack_ffffffffffffff64 << 0x20);
        local_58->rw_func[1].tag = 2;
        list_add_tail((list_head *)in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->link);
      }
      v.tag._0_4_ = in_stack_ffffffffffffff60;
      v.u = (JSValueUnion)in_stack_ffffffffffffff58;
      v.tag._4_4_ = in_stack_ffffffffffffff64;
      JS_FreeValue(in_stack_ffffffffffffff50,v);
      pJVar7 = &local_58->rw_func[in_R9D].u;
      JVar6 = JS_DupValue(in_RDI,JVar2);
      *pJVar7 = JVar6.u;
      pJVar7[1] = (JSValueUnion)JVar6.tag;
    }
    else {
      pJVar5 = find_rh(ts_00,local_5c);
      if (pJVar5 != (JSOSRWHandler *)0x0) {
        JVar2.tag._0_4_ = in_stack_ffffffffffffff60;
        JVar2.u.ptr = (void *)in_stack_ffffffffffffff58;
        JVar2.tag._4_4_ = in_stack_ffffffffffffff64;
        JS_FreeValue(in_stack_ffffffffffffff50,JVar2);
        pJVar5->rw_func[in_R9D].u.ptr = (void *)((ulong)in_stack_ffffffffffffff84 << 0x20);
        pJVar5->rw_func[in_R9D].tag = 2;
        iVar4 = JS_IsNull(pJVar5->rw_func[0]);
        if ((iVar4 != 0) && (iVar4 = JS_IsNull(pJVar5->rw_func[1]), iVar4 != 0)) {
          JS_GetRuntime(in_RDI);
          free_rw_handler((JSRuntime *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
      }
    }
    local_10.ptr = (void *)(lVar3 << 0x20);
    local_8 = 3;
  }
  else {
    local_10.ptr = (void *)(lVar3 << 0x20);
    local_8 = 6;
  }
  return _local_10;
}

Assistant:

static JSValue js_os_setReadHandler(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv, int magic)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    JSOSRWHandler *rh;
    int fd;
    JSValueConst func;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    func = argv[1];
    if (JS_IsNull(func)) {
        rh = find_rh(ts, fd);
        if (rh) {
            JS_FreeValue(ctx, rh->rw_func[magic]);
            rh->rw_func[magic] = JS_NULL;
            if (JS_IsNull(rh->rw_func[0]) &&
                JS_IsNull(rh->rw_func[1])) {
                /* remove the entry */
                free_rw_handler(JS_GetRuntime(ctx), rh);
            }
        }
    } else {
        if (!JS_IsFunction(ctx, func))
            return JS_ThrowTypeError(ctx, "not a function");
        rh = find_rh(ts, fd);
        if (!rh) {
            rh = js_mallocz(ctx, sizeof(*rh));
            if (!rh)
                return JS_EXCEPTION;
            rh->fd = fd;
            rh->rw_func[0] = JS_NULL;
            rh->rw_func[1] = JS_NULL;
            list_add_tail(&rh->link, &ts->os_rw_handlers);
        }
        JS_FreeValue(ctx, rh->rw_func[magic]);
        rh->rw_func[magic] = JS_DupValue(ctx, func);
    }
    return JS_UNDEFINED;
}